

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc,xmlChar *name,int type,xmlChar *ExternalID,xmlChar *SystemID,
            xmlChar *content)

{
  xmlDictPtr local_50;
  xmlDictPtr dict;
  xmlEntityPtr ret;
  xmlChar *content_local;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  int type_local;
  xmlChar *name_local;
  xmlDocPtr doc_local;
  
  if ((doc == (xmlDocPtr)0x0) || (doc->intSubset == (_xmlDtd *)0x0)) {
    if (doc == (xmlDocPtr)0x0) {
      local_50 = (xmlDictPtr)0x0;
    }
    else {
      local_50 = doc->dict;
    }
    doc_local = (xmlDocPtr)xmlCreateEntity(local_50,name,type,ExternalID,SystemID,content);
    if (doc_local == (xmlDocPtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local->doc = doc;
    }
  }
  else {
    doc_local = (xmlDocPtr)xmlAddDocEntity(doc,name,type,ExternalID,SystemID,content);
  }
  return (xmlEntityPtr)doc_local;
}

Assistant:

xmlEntityPtr
xmlNewEntity(xmlDocPtr doc, const xmlChar *name, int type,
	     const xmlChar *ExternalID, const xmlChar *SystemID,
	     const xmlChar *content) {
    xmlEntityPtr ret;
    xmlDictPtr dict;

    if ((doc != NULL) && (doc->intSubset != NULL)) {
	return(xmlAddDocEntity(doc, name, type, ExternalID, SystemID, content));
    }
    if (doc != NULL)
        dict = doc->dict;
    else
        dict = NULL;
    ret = xmlCreateEntity(dict, name, type, ExternalID, SystemID, content);
    if (ret == NULL)
        return(NULL);
    ret->doc = doc;
    return(ret);
}